

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O2

void __thiscall
myvk::QueueSelectionResolver::FetchDeviceQueues(QueueSelectionResolver *this,Ptr<Device> *device)

{
  _Rb_tree_color family_index;
  _Base_ptr p_Var1;
  undefined8 *puVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  uint queue_index;
  ulong uVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  Ptr<UniqueQueue> unique_queue;
  
  for (p_Var3 = (this->m_queue_creations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->m_queue_creations)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    family_index = p_Var3[1]._M_color;
    queue_index = 0;
    while( true ) {
      uVar5 = (ulong)queue_index;
      if ((ulong)(((long)p_Var3[1]._M_left - (long)p_Var3[1]._M_parent) / 0x18) <= uVar5) break;
      UniqueQueue::Create((UniqueQueue *)&unique_queue,device,family_index,queue_index);
      p_Var1 = (&(p_Var3[1]._M_parent)->_M_parent)[uVar5 * 3];
      for (p_Var4 = *(_Base_ptr *)(&(p_Var3[1]._M_parent)->_M_color + uVar5 * 6); p_Var4 != p_Var1;
          p_Var4 = (_Base_ptr)&p_Var4->_M_parent) {
        puVar2 = *(undefined8 **)p_Var4;
        if (puVar2[2] == 0) {
          Queue::Create((Queue *)&stack0xffffffffffffffb0,&unique_queue);
          std::__shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2> *)*puVar2,
                     (__shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2> *)
                     &stack0xffffffffffffffb0);
        }
        else {
          PresentQueue::Create
                    ((PresentQueue *)&stack0xffffffffffffffb0,&unique_queue,
                     (Ptr<Surface> *)(puVar2 + 2));
          std::__shared_ptr<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2> *)*puVar2,
                     (__shared_ptr<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2> *)
                     &stack0xffffffffffffffb0);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&unique_queue.super___shared_ptr<myvk::UniqueQueue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      queue_index = queue_index + 1;
    }
  }
  return;
}

Assistant:

void QueueSelectionResolver::FetchDeviceQueues(const Ptr<Device> &device) const {
	for (const auto &creation : m_queue_creations) {
		uint32_t family = creation.first;
		for (uint32_t index = 0; index < creation.second.size(); ++index) {
			Ptr<UniqueQueue> unique_queue = UniqueQueue::Create(device, family, index);
			for (QueueSelection *selection : creation.second[index]) {
				if (selection->IsPresentQueue())
					selection->GetPresentQueueTargetRef() =
					    PresentQueue::Create(unique_queue, selection->GetSurfacePtr());
				else {
					selection->GetQueueTargetRef() = Queue::Create(unique_queue);
				}
			}
		}
	}
}